

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultCoverageBinInitializerSyntax,slang::syntax::DefaultCoverageBinInitializerSyntax_const&>
          (BumpAllocator *this,DefaultCoverageBinInitializerSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  DefaultCoverageBinInitializerSyntax *pDVar13;
  
  pDVar13 = (DefaultCoverageBinInitializerSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode;
  TVar5 = (args->defaultKeyword).kind;
  uVar6 = (args->defaultKeyword).field_0x2;
  NVar7.raw = (args->defaultKeyword).numFlags.raw;
  uVar8 = (args->defaultKeyword).rawLen;
  pIVar3 = (args->defaultKeyword).info;
  TVar9 = (args->sequenceKeyword).kind;
  uVar10 = (args->sequenceKeyword).field_0x2;
  NVar11.raw = (args->sequenceKeyword).numFlags.raw;
  uVar12 = (args->sequenceKeyword).rawLen;
  (pDVar13->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind =
       (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar13->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pDVar13->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar13->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar13->defaultKeyword).kind = TVar5;
  (pDVar13->defaultKeyword).field_0x2 = uVar6;
  (pDVar13->defaultKeyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar13->defaultKeyword).rawLen = uVar8;
  (pDVar13->defaultKeyword).info = pIVar3;
  (pDVar13->sequenceKeyword).kind = TVar9;
  (pDVar13->sequenceKeyword).field_0x2 = uVar10;
  (pDVar13->sequenceKeyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar13->sequenceKeyword).rawLen = uVar12;
  (pDVar13->sequenceKeyword).info = (args->sequenceKeyword).info;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }